

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O0

void anon_unknown.dwarf_3cd9::test_iterator_advance(void **param_1)

{
  _Bool _Var1;
  undefined1 uVar2;
  roaring64_iterator_t *it_00;
  char *file;
  roaring64_iterator_t *it;
  size_t i;
  uint64_t v;
  uint64_t i_1;
  roaring64_bulk_context_t context;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  roaring64_bitmap_t *r;
  int in_stack_ffffffffffffff5c;
  roaring64_bitmap_t *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar3;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  roaring64_bitmap_t *in_stack_ffffffffffffff80;
  size_type in_stack_ffffffffffffff88;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_60;
  ulong local_50;
  undefined1 local_48 [40];
  roaring64_bitmap_t *in_stack_ffffffffffffffe0;
  
  roaring64_bitmap_create();
  pvVar3 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_48 + 0x20);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x10850e);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (pvVar3,in_stack_ffffffffffffff88);
  memset(local_48,0,0x10);
  for (local_50 = 0; local_50 < 1000; local_50 = local_50 + 1) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (in_stack_ffffffffffffff70,
               (value_type *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    roaring64_bitmap_add_bulk
              (in_stack_ffffffffffffff80,
               (roaring64_bulk_context_t *)
               CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
               (uint64_t)in_stack_ffffffffffffff70);
  }
  local_60 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
  it_00 = roaring64_iterator_create(in_stack_ffffffffffffff60);
  pvVar3 = local_60;
  do {
    local_60 = pvVar3;
    roaring64_iterator_value(it_00);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_48 + 0x20),
               (size_type)local_60);
    _assert_int_equal((unsigned_long)in_stack_ffffffffffffff70,
                      CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                      (char *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    pvVar3 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             ((long)&(local_60->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_start + 1);
    _Var1 = roaring64_iterator_advance
                      ((roaring64_iterator_t *)
                       CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  } while (_Var1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_48 + 0x20));
  _assert_int_equal((unsigned_long)pvVar3,
                    CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                    (char *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  uVar2 = roaring64_iterator_previous
                    ((roaring64_iterator_t *)
                     CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  _assert_true((unsigned_long)pvVar3,(char *)CONCAT17(uVar2,in_stack_ffffffffffffff68),
               (char *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  file = (char *)roaring64_iterator_value(it_00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_48 + 0x20),
             (size_type)local_60);
  _assert_int_equal((unsigned_long)pvVar3,CONCAT17(uVar2,in_stack_ffffffffffffff68),file,
                    in_stack_ffffffffffffff5c);
  _Var1 = roaring64_iterator_advance
                    ((roaring64_iterator_t *)CONCAT17(uVar2,in_stack_ffffffffffffff68));
  _assert_true((unsigned_long)pvVar3,(char *)CONCAT17(uVar2,in_stack_ffffffffffffff68),file,
               CONCAT13(_Var1,(int3)in_stack_ffffffffffffff5c));
  roaring64_iterator_free((roaring64_iterator_t *)0x108736);
  roaring64_bitmap_free(in_stack_ffffffffffffffe0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(pvVar3);
  return;
}

Assistant:

DEFINE_TEST(test_iterator_advance) {
    roaring64_bitmap_t* r = roaring64_bitmap_create();
    std::vector<uint64_t> values;
    values.reserve(1000);
    roaring64_bulk_context_t context{};
    for (uint64_t i = 0; i < 1000; ++i) {
        uint64_t v = i * 10000;
        values.push_back(v);
        roaring64_bitmap_add_bulk(r, &context, v);
    }
    size_t i = 0;
    roaring64_iterator_t* it = roaring64_iterator_create(r);
    do {
        assert_int_equal(roaring64_iterator_value(it), values[i]);
        i++;
    } while (roaring64_iterator_advance(it));
    assert_int_equal(i, values.size());

    // Check that we can move backward from after the last entry.
    assert_true(roaring64_iterator_previous(it));
    i--;
    assert_int_equal(roaring64_iterator_value(it), values[i]);

    // Check that we can't move forward again.
    assert_false(roaring64_iterator_advance(it));

    roaring64_iterator_free(it);
    roaring64_bitmap_free(r);
}